

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
yy::parser::basic_symbol<yy::parser::by_kind>::clear(basic_symbol<yy::parser::by_kind> *this)

{
  symbol_kind_type sVar1;
  basic_symbol<yy::parser::by_kind> *yysym;
  symbol_kind_type yykind;
  basic_symbol<yy::parser::by_kind> *this_local;
  
  sVar1 = by_kind::kind(&this->super_by_kind);
  if ((sVar1 != S_IDENTIFIER) && (sVar1 != S_BRACKET_ARGUMENT)) {
    if (sVar1 == S_REF_OPEN) {
      value_type::destroy<ReferenceType>(&this->value);
      goto LAB_00105cac;
    }
    if (2 < (uint)(sVar1 + ~S_REF_CLOSE)) {
      if (((((uint)(sVar1 + ~S_29_3) < 3) || ((uint)(sVar1 + ~S_argument) < 2)) ||
          (sVar1 == S_unquoted_argument)) || ((uint)(sVar1 + ~S_unquoted_element) < 2)) {
        value_type::destroy<unsigned_long>(&this->value);
      }
      goto LAB_00105cac;
    }
  }
  value_type::destroy<std::__cxx11::string>(&this->value);
LAB_00105cac:
  by_kind::clear(&this->super_by_kind);
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.template destroy< ReferenceType > ();
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.template destroy< std::size_t > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }